

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void upb_MtDecoder_PushItem(upb_MtDecoder *d,upb_LayoutItem item)

{
  upb_LayoutItem *puVar1;
  upb_LayoutItem *__ptr;
  size_t sVar2;
  undefined8 uVar3;
  ulong uVar4;
  
  uVar3 = item._0_8_;
  __ptr = (d->vec).data;
  sVar2 = (d->vec).size;
  if (sVar2 == (d->vec).capacity) {
    uVar4 = 8;
    if (8 < sVar2 * 2) {
      uVar4 = sVar2 * 2;
    }
    __ptr = (upb_LayoutItem *)realloc(__ptr,uVar4 * 0xc);
    (d->vec).data = __ptr;
    if (__ptr == (upb_LayoutItem *)0x0) {
      upb_MdDecoder_ErrorJmp(&d->base,"Out of memory");
    }
    (d->vec).capacity = uVar4;
    sVar2 = (d->vec).size;
  }
  (d->vec).size = sVar2 + 1;
  puVar1 = __ptr + sVar2;
  puVar1->field_index = (short)uVar3;
  puVar1->offset = (short)((ulong)uVar3 >> 0x10);
  puVar1->rep = (int)((ulong)uVar3 >> 0x20);
  __ptr[sVar2].type = item.type;
  return;
}

Assistant:

static void upb_MtDecoder_PushItem(upb_MtDecoder* d, upb_LayoutItem item) {
  if (d->vec.size == d->vec.capacity) {
    size_t new_cap = UPB_MAX(8, d->vec.size * 2);
    d->vec.data = realloc(d->vec.data, new_cap * sizeof(*d->vec.data));
    upb_MdDecoder_CheckOutOfMemory(&d->base, d->vec.data);
    d->vec.capacity = new_cap;
  }
  d->vec.data[d->vec.size++] = item;
}